

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lookup_response.h
# Opt level: O2

string __thiscall LookupResponse::ToString(LookupResponse *this)

{
  FileInfo::ToString((FileInfo *)&stack0xffffffffffffffe8);
  std::operator+((char *)this,
                 (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                 "LookupResponse:: ");
  std::string::~string(&stack0xffffffffffffffe8);
  return (string)(_Alloc_hider)this;
}

Assistant:

virtual string ToString() const {
    return "LookupResponse:: " + file_info_.ToString();
  }